

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O3

ssize_t archive_write_mtree_data(archive_write *a,void *buff,size_t n)

{
  long *plVar1;
  ulong uVar2;
  uint uVar3;
  
  plVar1 = (long *)a->format_data;
  uVar2 = plVar1[0xf];
  if (uVar2 < n) {
    n = uVar2;
  }
  plVar1[0xf] = uVar2 - n;
  if (((*plVar1 != 0) && (*(int *)(*plVar1 + 0xe4) == 0x8000)) &&
     ((*(byte *)(plVar1 + 0x1c) & 1) != 0)) {
    if (n != 0) {
      uVar3 = *(uint *)((long)plVar1 + 0xe4);
      uVar2 = 0;
      do {
        uVar3 = uVar3 << 8 ^ crctab[(uint)*(byte *)((long)buff + uVar2) ^ uVar3 >> 0x18];
        *(uint *)((long)plVar1 + 0xe4) = uVar3;
        uVar2 = uVar2 + 1;
      } while (n != uVar2);
    }
    plVar1[0x1d] = plVar1[0x1d] + n;
  }
  return n;
}

Assistant:

static ssize_t
archive_write_mtree_data(struct archive_write *a, const void *buff, size_t n)
{
	struct mtree_writer *mtree= a->format_data;

	if (n > mtree->entry_bytes_remaining)
		n = (size_t)mtree->entry_bytes_remaining;
	mtree->entry_bytes_remaining -= n;

	/* We don't need to compute a regular file sum */
	if (mtree->mtree_entry == NULL)
		return (n);

	if (mtree->mtree_entry->filetype == AE_IFREG)
		sum_update(mtree, buff, n);

	return (n);
}